

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-alloc-cb-fail.c
# Opt level: O2

void conn_read_cb(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  char *__format;
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  int64_t eval_b;
  int64_t eval_a;
  
  eval_b = -0x69;
  if (nread == -0x69) {
    eval_a = (int64_t)buf->base;
    if ((char *)eval_a != (char *)0x0) {
      eval_b = 0;
      pcVar2 = "NULL";
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
      pcVar1 = "buf->base";
      uVar3 = 0x38;
      goto LAB_0017cdb7;
    }
    eval_a = buf->len;
    eval_b = 0;
    if (eval_a == 0) {
      uv_close((uv_handle_t *)&incoming,close_cb);
      uv_close((uv_handle_t *)&client,close_cb);
      uv_close((uv_handle_t *)&server,close_cb);
      return;
    }
    pcVar2 = "0";
    pcVar1 = "buf->len";
    uVar3 = 0x39;
  }
  else {
    pcVar2 = "UV_ENOBUFS";
    pcVar1 = "nread";
    uVar3 = 0x37;
    eval_a = nread;
  }
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
LAB_0017cdb7:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-alloc-cb-fail.c"
          ,uVar3,pcVar1,"==",pcVar2,eval_a,"==",eval_b);
  abort();
}

Assistant:

static void conn_read_cb(uv_stream_t* stream,
                         ssize_t nread,
                         const uv_buf_t* buf) {
  ASSERT_EQ(nread, UV_ENOBUFS);
  ASSERT_NULL(buf->base);
  ASSERT_OK(buf->len);

  uv_close((uv_handle_t*) &incoming, close_cb);
  uv_close((uv_handle_t*) &client, close_cb);
  uv_close((uv_handle_t*) &server, close_cb);
}